

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawChannel *pIVar1;
  ImVector<unsigned_int> *pIVar2;
  ImDrawCmd *pIVar3;
  uint *puVar4;
  int iVar5;
  
  if ((-1 < idx) && (idx < this->_Count)) {
    if (this->_Current != idx) {
      iVar5 = (draw_list->CmdBuffer).Capacity;
      pIVar3 = (draw_list->CmdBuffer).Data;
      pIVar1 = (this->_Channels).Data + this->_Current;
      (pIVar1->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
      (pIVar1->_CmdBuffer).Capacity = iVar5;
      (pIVar1->_CmdBuffer).Data = pIVar3;
      iVar5 = (draw_list->IdxBuffer).Capacity;
      puVar4 = (draw_list->IdxBuffer).Data;
      pIVar2 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
      pIVar2->Size = (draw_list->IdxBuffer).Size;
      pIVar2->Capacity = iVar5;
      pIVar2->Data = puVar4;
      this->_Current = idx;
      pIVar1 = (this->_Channels).Data + (uint)idx;
      iVar5 = (pIVar1->_CmdBuffer).Capacity;
      pIVar3 = (pIVar1->_CmdBuffer).Data;
      (draw_list->CmdBuffer).Size = (pIVar1->_CmdBuffer).Size;
      (draw_list->CmdBuffer).Capacity = iVar5;
      (draw_list->CmdBuffer).Data = pIVar3;
      pIVar2 = &(this->_Channels).Data[(uint)idx]._IdxBuffer;
      iVar5 = pIVar2->Capacity;
      puVar4 = pIVar2->Data;
      (draw_list->IdxBuffer).Size = pIVar2->Size;
      (draw_list->IdxBuffer).Capacity = iVar5;
      (draw_list->IdxBuffer).Data = puVar4;
      draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
    }
    return;
  }
  __assert_fail("idx >= 0 && idx < _Count",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x585,"void ImDrawListSplitter::SetCurrentChannel(ImDrawList *, int)");
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;
    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;
}